

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3ColumnlistCopy(char **pp,char **ppPoslist)

{
  char *__dest;
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  
  lVar3 = 0;
  bVar1 = 0;
  for (pbVar2 = (byte *)*ppPoslist; (*pbVar2 & 0xfe) != 0 || bVar1 != 0; pbVar2 = pbVar2 + 1) {
    bVar1 = *pbVar2 & 0x80;
    lVar3 = lVar3 + 0x100000000;
  }
  if (pp != (char **)0x0) {
    __dest = *pp;
    memcpy(__dest,*ppPoslist,lVar3 >> 0x20);
    *pp = __dest + (lVar3 >> 0x20);
  }
  *ppPoslist = (char *)pbVar2;
  return;
}

Assistant:

static void fts3ColumnlistCopy(char **pp, char **ppPoslist){
  char *pEnd = *ppPoslist;
  char c = 0;

  /* A column-list is terminated by either a 0x01 or 0x00 byte that is
  ** not part of a multi-byte varint.
  */
  while( 0xFE & (*pEnd | c) ){
    c = *pEnd++ & 0x80;
    testcase( c!=0 && ((*pEnd)&0xfe)==0 );
  }
  if( pp ){
    int n = (int)(pEnd - *ppPoslist);
    char *p = *pp;
    memcpy(p, *ppPoslist, n);
    p += n;
    *pp = p;
  }
  *ppPoslist = pEnd;
}